

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

bool __thiscall brynet::net::EventLoop::wakeup(EventLoop *this)

{
  __int_type _Var1;
  bool bVar2;
  
  bVar2 = isInLoopThread(this);
  if ((!bVar2) && (((this->mIsInBlock)._M_base._M_i & 1U) != 0)) {
    LOCK();
    _Var1 = (this->mIsAlreadyPostWakeup)._M_base._M_i;
    (this->mIsAlreadyPostWakeup)._M_base._M_i = true;
    UNLOCK();
    if ((_Var1 & 1U) == 0) {
      WakeupChannel::wakeup
                ((this->mWakeupChannel)._M_t.
                 super___uniq_ptr_impl<brynet::net::WakeupChannel,_std::default_delete<brynet::net::WakeupChannel>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_brynet::net::WakeupChannel_*,_std::default_delete<brynet::net::WakeupChannel>_>
                 .super__Head_base<0UL,_brynet::net::WakeupChannel_*,_false>._M_head_impl);
      return true;
    }
  }
  return false;
}

Assistant:

bool EventLoop::wakeup()
{
    if (!isInLoopThread() && mIsInBlock && !mIsAlreadyPostWakeup.exchange(true))
    {
        mWakeupChannel->wakeup();
        return true;
    }

    return false;
}